

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ttload.c
# Opt level: O1

FT_Error tt_face_load_font_dir(TT_Face face,FT_Stream stream)

{
  FT_Memory memory;
  FT_UInt32 FVar1;
  FT_UInt32 FVar2;
  FT_UInt32 FVar3;
  uint uVar4;
  TT_Table pTVar5;
  ulong uVar6;
  ulong uVar7;
  ushort uVar8;
  ulong uVar9;
  bool bVar10;
  ulong uVar11;
  ushort uVar12;
  FT_ULong FVar13;
  uint uVar14;
  FT_Error error_1;
  FT_Error error;
  SFNT_HeaderRec sfnt;
  uint local_88;
  uint local_84;
  ulong local_80;
  int local_78;
  int local_74;
  ulong local_70;
  ushort local_68;
  FT_ULong local_60;
  undefined8 local_58;
  long local_50 [2];
  ulong local_40;
  ulong local_38;
  
  memory = stream->memory;
  local_60 = FT_Stream_Pos(stream);
  FVar1 = FT_Stream_ReadULong(stream,(FT_Error *)&local_84);
  local_70 = (ulong)FVar1;
  if ((local_84 == 0) &&
     (local_84 = FT_Stream_ReadFields(stream,tt_face_load_font_dir::offset_table_fields,&local_70),
     FVar13 = local_60, local_84 == 0)) {
    if (local_70 == 0x4f54544f) {
      uVar8 = local_68;
      if (local_68 == 0) {
        return 2;
      }
    }
    else {
      local_88 = FT_Stream_Seek(stream,local_60 + 0xc);
      if (local_88 == 0) {
        bVar10 = false;
        if (local_68 == 0) {
          uVar8 = 0;
        }
        else {
          local_58 = 0;
          FVar13 = FVar13 + 0x1c;
          uVar11 = 0;
          local_74 = 0;
          local_78 = 0;
          local_80 = local_80 & 0xffffffff00000000;
          local_88 = 0;
          do {
            local_88 = FT_Stream_ReadFields
                                 (stream,(FT_Frame_Field *)check_table_dir_table_dir_entry_fields,
                                  local_50);
            uVar7 = (ulong)local_88;
            if (local_88 == 0) {
              uVar14 = 5;
              if ((local_40 <= stream->size) &&
                 (((uVar7 = local_38, local_38 <= stream->size - local_40 ||
                   (local_50[0] == 0x766d7478)) || (local_50[0] == 0x686d7478)))) {
                local_80 = CONCAT44(local_80._4_4_,(int)local_80 + 1);
                uVar14 = 0;
                if (local_50[0] < 0x62686564) {
                  if (local_50[0] == 0x4d455441) {
                    local_58 = 1;
                    uVar7 = 1;
                  }
                  else if (local_50[0] == 0x53494e47) {
                    local_74 = 1;
                  }
                }
                else if ((local_50[0] == 0x68656164) || (local_50[0] == 0x62686564)) {
                  if (local_38 < 0x36) {
                    local_88 = 0x8e;
                    uVar14 = 2;
                    local_78 = 1;
                  }
                  else {
                    local_88 = FT_Stream_Seek(stream,local_40 + 0xc);
                    uVar7 = (ulong)local_88;
                    uVar14 = 2;
                    local_78 = 1;
                    if (local_88 == 0) {
                      FVar1 = FT_Stream_ReadULong(stream,(FT_Error *)&local_88);
                      uVar7 = (ulong)FVar1;
                      if (local_88 == 0) {
                        local_88 = FT_Stream_Seek(stream,FVar13);
                        uVar7 = (ulong)local_88;
                        uVar14 = (uint)(local_88 != 0) * 2;
                      }
                    }
                  }
                }
              }
            }
            else {
              local_68 = (ushort)uVar11;
              uVar14 = 3;
            }
            uVar4 = (uint)uVar7;
            if (5 < uVar14) {
switchD_00249c49_caseD_1:
              uVar8 = 0;
              local_84 = uVar4;
              goto LAB_00249a66;
            }
            uVar4 = (&switchD_00249c49::switchdataD_00309d08)[uVar14] + 0x309d08;
            switch(uVar14) {
            case 1:
            case 4:
              goto switchD_00249c49_caseD_1;
            case 2:
              goto switchD_00249c49_caseD_2;
            case 3:
              goto switchD_00249c49_caseD_3;
            }
            uVar11 = uVar11 + 1;
            FVar13 = FVar13 + 0x10;
          } while (uVar11 < local_68);
switchD_00249c49_caseD_3:
          bVar10 = (int)local_58 != 0 && local_74 != 0 || local_78 != 0;
          uVar8 = (ushort)local_80;
        }
        if (uVar8 == 0) {
          local_88 = 2;
          local_84 = local_88;
        }
        else if (bVar10) {
          local_88 = 0;
          local_84 = local_88;
        }
        else {
          local_88 = 0x8e;
          local_84 = local_88;
        }
      }
      else {
switchD_00249c49_caseD_2:
        uVar8 = 0;
        local_84 = local_88;
      }
LAB_00249a66:
      if (local_84 != 0) {
        return local_84;
      }
    }
    face->num_tables = uVar8;
    face->format_tag = local_70;
    pTVar5 = (TT_Table)ft_mem_qrealloc(memory,0x20,0,(ulong)uVar8,(void *)0x0,(FT_Error *)&local_84)
    ;
    face->dir_tables = pTVar5;
    if (((local_84 == 0) && (local_84 = FT_Stream_Seek(stream,local_60 + 0xc), local_84 == 0)) &&
       (local_84 = FT_Stream_EnterFrame(stream,(ulong)local_68 << 4), local_84 == 0)) {
      if (local_68 == 0) {
        local_80 = 0;
      }
      else {
        uVar8 = 0;
        local_80 = 0;
        do {
          FVar1 = FT_Stream_GetULong(stream);
          FVar2 = FT_Stream_GetULong(stream);
          FVar3 = FT_Stream_GetULong(stream);
          uVar7 = (ulong)FVar3;
          FVar3 = FT_Stream_GetULong(stream);
          uVar11 = stream->size - uVar7;
          if (uVar7 <= stream->size) {
            uVar9 = (ulong)FVar1;
            uVar6 = (ulong)FVar3;
            if (uVar11 < uVar6) {
              if ((uVar9 != 0x686d7478) && (FVar1 != 0x766d7478)) goto LAB_00249ba9;
              uVar6 = (ulong)((uint)uVar11 & 0xfffffffc);
            }
            if ((ushort)local_80 != 0) {
              pTVar5 = face->dir_tables;
              uVar11 = local_80;
              do {
                if (pTVar5->Tag == uVar9) goto LAB_00249ba9;
                pTVar5 = pTVar5 + 1;
                uVar12 = (short)uVar11 - 1;
                uVar11 = (ulong)uVar12;
              } while (uVar12 != 0);
            }
            pTVar5 = face->dir_tables;
            uVar11 = (ulong)(((uint)local_80 & 0xffff) << 5);
            *(ulong *)((long)&pTVar5->Tag + uVar11) = uVar9;
            *(ulong *)((long)&pTVar5->CheckSum + uVar11) = (ulong)FVar2;
            *(ulong *)((long)&pTVar5->Offset + uVar11) = uVar7;
            *(ulong *)((long)&pTVar5->Length + uVar11) = uVar6;
            local_80 = (ulong)((uint)local_80 + 1);
          }
LAB_00249ba9:
          uVar8 = uVar8 + 1;
        } while (uVar8 < local_68);
      }
      face->num_tables = (FT_UShort)local_80;
      FT_Stream_ExitFrame(stream);
    }
  }
  return local_84;
}

Assistant:

FT_LOCAL_DEF( FT_Error )
  tt_face_load_font_dir( TT_Face    face,
                         FT_Stream  stream )
  {
    SFNT_HeaderRec  sfnt;
    FT_Error        error;
    FT_Memory       memory = stream->memory;
    FT_UShort       nn, valid_entries = 0;

    static const FT_Frame_Field  offset_table_fields[] =
    {
#undef  FT_STRUCTURE
#define FT_STRUCTURE  SFNT_HeaderRec

      FT_FRAME_START( 8 ),
        FT_FRAME_USHORT( num_tables ),
        FT_FRAME_USHORT( search_range ),
        FT_FRAME_USHORT( entry_selector ),
        FT_FRAME_USHORT( range_shift ),
      FT_FRAME_END
    };


    FT_TRACE2(( "tt_face_load_font_dir: %p\n", (void *)face ));

    /* read the offset table */

    sfnt.offset = FT_STREAM_POS();

    if ( FT_READ_ULONG( sfnt.format_tag )                    ||
         FT_STREAM_READ_FIELDS( offset_table_fields, &sfnt ) )
      goto Exit;

    /* many fonts don't have these fields set correctly */
#if 0
    if ( sfnt.search_range != 1 << ( sfnt.entry_selector + 4 )        ||
         sfnt.search_range + sfnt.range_shift != sfnt.num_tables << 4 )
      return FT_THROW( Unknown_File_Format );
#endif

    /* load the table directory */

    FT_TRACE2(( "-- Number of tables: %10hu\n",   sfnt.num_tables ));
    FT_TRACE2(( "-- Format version:   0x%08lx\n", sfnt.format_tag ));

    if ( sfnt.format_tag != TTAG_OTTO )
    {
      /* check first */
      error = check_table_dir( &sfnt, stream, &valid_entries );
      if ( error )
      {
        FT_TRACE2(( "tt_face_load_font_dir:"
                    " invalid table directory for TrueType\n" ));
        goto Exit;
      }
    }
    else
    {
      valid_entries = sfnt.num_tables;
      if ( !valid_entries )
      {
        FT_TRACE2(( "tt_face_load_font_dir: no valid tables found\n" ));
        error = FT_THROW( Unknown_File_Format );
        goto Exit;
      }
    }

    face->num_tables = valid_entries;
    face->format_tag = sfnt.format_tag;

    if ( FT_QNEW_ARRAY( face->dir_tables, face->num_tables ) )
      goto Exit;

    if ( FT_STREAM_SEEK( sfnt.offset + 12 )      ||
         FT_FRAME_ENTER( sfnt.num_tables * 16L ) )
      goto Exit;

    FT_TRACE2(( "\n" ));
    FT_TRACE2(( "  tag    offset    length   checksum\n" ));
    FT_TRACE2(( "  ----------------------------------\n" ));

    valid_entries = 0;
    for ( nn = 0; nn < sfnt.num_tables; nn++ )
    {
      TT_TableRec  entry;
      FT_UShort    i;
      FT_Bool      duplicate;


      entry.Tag      = FT_GET_TAG4();
      entry.CheckSum = FT_GET_ULONG();
      entry.Offset   = FT_GET_ULONG();
      entry.Length   = FT_GET_ULONG();

      /* ignore invalid tables that can't be sanitized */

      if ( entry.Offset > stream->size )
        continue;
      else if ( entry.Length > stream->size - entry.Offset )
      {
        if ( entry.Tag == TTAG_hmtx ||
             entry.Tag == TTAG_vmtx )
        {
#ifdef FT_DEBUG_LEVEL_TRACE
          FT_ULong  old_length = entry.Length;
#endif


          /* make metrics table length a multiple of 4 */
          entry.Length = ( stream->size - entry.Offset ) & ~3U;

          FT_TRACE2(( "  %c%c%c%c  %08lx  %08lx  %08lx"
                      " (sanitized; original length %08lx)",
                      (FT_Char)( entry.Tag >> 24 ),
                      (FT_Char)( entry.Tag >> 16 ),
                      (FT_Char)( entry.Tag >> 8  ),
                      (FT_Char)( entry.Tag       ),
                      entry.Offset,
                      entry.Length,
                      entry.CheckSum,
                      old_length ));
        }
        else
          continue;
      }
#ifdef FT_DEBUG_LEVEL_TRACE
      else
        FT_TRACE2(( "  %c%c%c%c  %08lx  %08lx  %08lx",
                    (FT_Char)( entry.Tag >> 24 ),
                    (FT_Char)( entry.Tag >> 16 ),
                    (FT_Char)( entry.Tag >> 8  ),
                    (FT_Char)( entry.Tag       ),
                    entry.Offset,
                    entry.Length,
                    entry.CheckSum ));
#endif

      /* ignore duplicate tables – the first one wins */
      duplicate = 0;
      for ( i = 0; i < valid_entries; i++ )
      {
        if ( face->dir_tables[i].Tag == entry.Tag )
        {
          duplicate = 1;
          break;
        }
      }
      if ( duplicate )
      {
        FT_TRACE2(( "  (duplicate, ignored)\n" ));
        continue;
      }
      else
      {
        FT_TRACE2(( "\n" ));

        /* we finally have a valid entry */
        face->dir_tables[valid_entries++] = entry;
      }
    }

    /* final adjustment to number of tables */
    face->num_tables = valid_entries;

    FT_FRAME_EXIT();

    FT_TRACE2(( "table directory loaded\n" ));
    FT_TRACE2(( "\n" ));

  Exit:
    return error;
  }